

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t XXH3_rrmxmx(xxh_u64 h64,xxh_u64 len)

{
  ulong uVar1;
  xxh_u64 xVar2;
  long in_RSI;
  ulong in_RDI;
  
  uVar1 = ((in_RDI << 0x31 | in_RDI >> 0xf) ^ (in_RDI << 0x18 | in_RDI >> 0x28) ^ in_RDI) *
          -0x604de39ae16720db;
  xVar2 = XXH_xorshift64(((uVar1 >> 0x23) + in_RSI ^ uVar1) * -0x604de39ae16720db,0x1c);
  return xVar2;
}

Assistant:

static XXH64_hash_t XXH3_rrmxmx(xxh_u64 h64, xxh_u64 len) {
  /* this mix is inspired by Pelle Evensen's rrmxmx */
  h64 ^= XXH_rotl64(h64, 49) ^ XXH_rotl64(h64, 24);
  h64 *= 0x9FB21C651E98DF25ULL;
  h64 ^= (h64 >> 35) + len;
  h64 *= 0x9FB21C651E98DF25ULL;
  return XXH_xorshift64(h64, 28);
}